

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

LaneArray<8> * __thiscall
wasm::getLanes<short,8>(LaneArray<8> *__return_storage_ptr__,wasm *this,Literal *val)

{
  Literal *other;
  Literal *this_00;
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  byte *pbVar4;
  long lVar5;
  undefined1 local_58 [8];
  array<unsigned_char,_16UL> bytes;
  
  if (*(long *)(this + 0x10) == 6) {
    _local_58 = Literal::getv128((Literal *)this);
    pbVar4 = local_58;
    lVar5 = 0;
    memset(__return_storage_ptr__,0,0xc0);
    other = (Literal *)(bytes._M_elems + 8);
    do {
      lVar2 = 0;
      uVar3 = 0;
      pbVar1 = pbVar4;
      do {
        uVar3 = uVar3 | (uint)*pbVar1 << ((byte)lVar2 & 0x1f);
        lVar2 = lVar2 + 8;
        pbVar1 = pbVar1 + 1;
      } while (lVar2 == 8);
      bytes._M_elems._8_4_ = SEXT24((short)uVar3);
      this_00 = __return_storage_ptr__->_M_elems + lVar5;
      if (this_00 != other) {
        Literal::~Literal(this_00);
        Literal::Literal(this_00,other);
      }
      Literal::~Literal(other);
      lVar5 = lVar5 + 1;
      pbVar4 = pbVar4 + 2;
    } while (lVar5 != 8);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x647,"LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = short, Lanes = 8]"
               );
}

Assistant:

static LaneArray<Lanes> getLanes(const Literal& val) {
  assert(val.type == Type::v128);
  const size_t lane_width = 16 / Lanes;
  std::array<uint8_t, 16> bytes = val.getv128();
  LaneArray<Lanes> lanes;
  for (size_t lane_index = 0; lane_index < Lanes; ++lane_index) {
    LaneT lane(0);
    for (size_t offset = 0; offset < lane_width; ++offset) {
      lane |= LaneT(bytes.at(lane_index * lane_width + offset))
              << LaneT(8 * offset);
    }
    lanes.at(lane_index) = Literal(lane);
  }
  return lanes;
}